

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void TrueMotion(uint8_t *dst,uint8_t *left,uint8_t *top,int size)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (left == (uint8_t *)0x0) {
    if (top != (uint8_t *)0x0) {
      VerticalPred(dst,top,size);
      return;
    }
    Fill(dst,0x81,size);
    return;
  }
  if (top != (uint8_t *)0x0) {
    bVar1 = left[-1];
    uVar3 = 0;
    uVar4 = 0;
    if (0 < size) {
      uVar4 = (ulong)(uint)size;
    }
    for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
      bVar2 = left[uVar3];
      for (uVar5 = 0; (uint)size != uVar5; uVar5 = uVar5 + 1) {
        dst[uVar5] = clip1[(ulong)top[uVar5] + (ulong)bVar2 + (0xff - (ulong)bVar1)];
      }
      dst = dst + 0x20;
    }
    return;
  }
  HorizontalPred(dst,left,size);
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion(uint8_t* WEBP_RESTRICT dst,
                                   const uint8_t* WEBP_RESTRICT left,
                                   const uint8_t* WEBP_RESTRICT top, int size) {
  int y;
  if (left != NULL) {
    if (top != NULL) {
      const uint8_t* const clip = clip1 + 255 - left[-1];
      for (y = 0; y < size; ++y) {
        const uint8_t* const clip_table = clip + left[y];
        int x;
        for (x = 0; x < size; ++x) {
          dst[x] = clip_table[top[x]];
        }
        dst += BPS;
      }
    } else {
      HorizontalPred(dst, left, size);
    }
  } else {
    // true motion without left samples (hence: with default 129 value)
    // is equivalent to VE prediction where you just copy the top samples.
    // Note that if top samples are not available, the default value is
    // then 129, and not 127 as in the VerticalPred case.
    if (top != NULL) {
      VerticalPred(dst, top, size);
    } else {
      Fill(dst, 129, size);
    }
  }
}